

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::DefParamSymbol::resolve(DefParamSymbol *this)

{
  char *pcVar1;
  undefined4 uVar2;
  SymbolKind SVar3;
  Symbol *pSVar4;
  Scope *pSVar5;
  Compilation *pCVar6;
  SourceLocation lhs;
  ExpressionSyntax *rhs;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  size_t sVar11;
  Diagnostic *pDVar12;
  Symbol *pSVar13;
  Type *this_00;
  value_type *elements;
  ulong uVar14;
  string_view *psVar15;
  value_type *elements_1;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  LookupLocation LVar28;
  SourceRange SVar29;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar30;
  IfaceConn IVar31;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffc58;
  Symbol *local_3a0;
  Scope *local_398;
  Symbol *local_390;
  anon_class_16_2_3fde98ca makeInvalid;
  SmallSet<const_slang::ast::Scope_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Scope_*,_32UL,_16UL>_>
  targetChain;
  undefined1 local_318 [24];
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  AssertionInstanceDetails *local_2d0;
  char local_2c8;
  char cStack_2c7;
  char cStack_2c6;
  byte bStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  byte bStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  byte bStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  byte bStack_2b9;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  byte bStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  byte bStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  byte bStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  byte bStack_2a9;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2a0;
  LookupResult result;
  
  pSVar4 = (Symbol *)(this->super_Symbol).parentScope;
  pSVar5 = (Scope *)(this->super_Symbol).originatingSyntax;
  pCVar6 = *(Compilation **)pSVar4;
  LVar28 = LookupLocation::before(&this->super_Symbol);
  local_300._8_4_ = LVar28.index;
  local_2d0 = (AssertionInstanceDetails *)0x0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  result.found = (Symbol *)0x0;
  result.systemSubroutine._0_5_ = 0;
  result.systemSubroutine._5_3_ = 0;
  result.upwardCount = 0;
  result.flags.m_bits = '\0';
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_300._16_16_ = (undefined1  [16])0x0;
  local_2e0 = (undefined1  [16])0x0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_398 = pSVar5;
  local_390 = pSVar4;
  local_300._0_8_ = pSVar4;
  Lookup::name((NameSyntax *)pSVar5->firstMember,(ASTContext *)local_300,
               (bitmask<slang::ast::LookupFlags>)0x80,&result);
  LookupResult::reportDiags(&result,(ASTContext *)local_300);
  pSVar4 = result.found;
  this->target = result.found;
  makeInvalid.this = this;
  makeInvalid.comp = pCVar6;
  if (result.found != (Symbol *)0x0) {
    if ((result.found)->kind == Parameter) {
      if (*(char *)&result.found[5].parentScope == '\x01') {
        SVar29 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_398->firstMember);
        pDVar12 = ASTContext::addDiag((ASTContext *)local_300,(DiagCode)0x280006,SVar29);
        Diagnostic::operator<<(pDVar12,pSVar4->name);
        resolve::anon_class_16_2_3fde98ca::operator()(&makeInvalid);
      }
      else {
        SmallSet<const_slang::ast::Scope_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Scope_*,_32UL,_16UL>_>
        ::SmallSet(&targetChain);
        pSVar13 = pSVar4;
        while (local_3a0 = (Symbol *)pSVar13->parentScope, local_3a0 != (Symbol *)0x0) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_3a0;
          uVar16 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar14 = uVar16 >> (targetChain._48_1_ & 0x3f);
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar16 & 0xff];
          uVar19 = 0;
          uVar18 = uVar14;
          do {
            pcVar1 = (char *)(targetChain._64_8_ + uVar18 * 0x10);
            local_2b8 = *pcVar1;
            cStack_2b7 = pcVar1[1];
            cStack_2b6 = pcVar1[2];
            bStack_2b5 = pcVar1[3];
            cStack_2b4 = pcVar1[4];
            cStack_2b3 = pcVar1[5];
            cStack_2b2 = pcVar1[6];
            bStack_2b1 = pcVar1[7];
            cStack_2b0 = pcVar1[8];
            cStack_2af = pcVar1[9];
            cStack_2ae = pcVar1[10];
            bStack_2ad = pcVar1[0xb];
            cStack_2ac = pcVar1[0xc];
            cStack_2ab = pcVar1[0xd];
            cStack_2aa = pcVar1[0xe];
            bStack_2a9 = pcVar1[0xf];
            cVar22 = (char)uVar2;
            auVar26[0] = -(local_2b8 == cVar22);
            cVar23 = (char)((uint)uVar2 >> 8);
            auVar26[1] = -(cStack_2b7 == cVar23);
            cVar24 = (char)((uint)uVar2 >> 0x10);
            auVar26[2] = -(cStack_2b6 == cVar24);
            bVar20 = (byte)((uint)uVar2 >> 0x18);
            auVar26[3] = -(bStack_2b5 == bVar20);
            auVar26[4] = -(cStack_2b4 == cVar22);
            auVar26[5] = -(cStack_2b3 == cVar23);
            auVar26[6] = -(cStack_2b2 == cVar24);
            auVar26[7] = -(bStack_2b1 == bVar20);
            auVar26[8] = -(cStack_2b0 == cVar22);
            auVar26[9] = -(cStack_2af == cVar23);
            auVar26[10] = -(cStack_2ae == cVar24);
            auVar26[0xb] = -(bStack_2ad == bVar20);
            auVar26[0xc] = -(cStack_2ac == cVar22);
            auVar26[0xd] = -(cStack_2ab == cVar23);
            auVar26[0xe] = -(cStack_2aa == cVar24);
            auVar26[0xf] = -(bStack_2a9 == bVar20);
            uVar10 = (ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe;
            if (uVar10 != 0) {
              uVar21 = (uint)uVar10;
              do {
                uVar7 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                if (local_3a0 == *(Symbol **)(targetChain._72_8_ + uVar18 * 0x78 + (ulong)uVar7 * 8)
                   ) goto LAB_002394cf;
                uVar21 = uVar21 - 1 & uVar21;
              } while (uVar21 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bStack_2a9) == 0)
            break;
            lVar17 = uVar18 + uVar19;
            uVar19 = uVar19 + 1;
            uVar18 = lVar17 + 1U & targetChain._56_8_;
          } while (uVar19 <= (ulong)targetChain._56_8_);
          if ((ulong)targetChain._88_8_ < (ulong)targetChain._80_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Scope_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<slang::ast::Scope_const*,32ul,16ul>>
            ::unchecked_emplace_at<slang::ast::Scope_const*&>
                      ((locator *)local_318,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Scope_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<slang::ast::Scope_const*,32ul,16ul>>
                        *)&targetChain.super_Storage.field_0x28,uVar14,uVar16,(Scope **)&local_3a0);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Scope_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<slang::ast::Scope_const*,32ul,16ul>>
            ::unchecked_emplace_with_rehash<slang::ast::Scope_const*&>
                      ((locator *)local_318,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Scope_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<slang::ast::Scope_const*,32ul,16ul>>
                        *)&targetChain.super_Storage.field_0x28,uVar16,(Scope **)&local_3a0);
          }
LAB_002394cf:
          pSVar13 = (Symbol *)(local_3a0->name)._M_len;
          if (pSVar13->kind == InstanceBody) {
            pSVar13 = (Symbol *)pSVar13[1].originatingSyntax;
          }
        }
        local_3a0 = local_390;
        bVar20 = 0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_3a0;
          uVar14 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar18 = uVar14 >> (targetChain._48_1_ & 0x3f);
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar14 & 0xff];
          uVar16 = 0;
          do {
            pcVar1 = (char *)(targetChain._64_8_ + uVar18 * 0x10);
            local_2c8 = *pcVar1;
            cStack_2c7 = pcVar1[1];
            cStack_2c6 = pcVar1[2];
            bStack_2c5 = pcVar1[3];
            cStack_2c4 = pcVar1[4];
            cStack_2c3 = pcVar1[5];
            cStack_2c2 = pcVar1[6];
            bStack_2c1 = pcVar1[7];
            cStack_2c0 = pcVar1[8];
            cStack_2bf = pcVar1[9];
            cStack_2be = pcVar1[10];
            bStack_2bd = pcVar1[0xb];
            cStack_2bc = pcVar1[0xc];
            cStack_2bb = pcVar1[0xd];
            cStack_2ba = pcVar1[0xe];
            bStack_2b9 = pcVar1[0xf];
            cVar22 = (char)uVar2;
            auVar27[0] = -(local_2c8 == cVar22);
            cVar23 = (char)((uint)uVar2 >> 8);
            auVar27[1] = -(cStack_2c7 == cVar23);
            cVar24 = (char)((uint)uVar2 >> 0x10);
            auVar27[2] = -(cStack_2c6 == cVar24);
            bVar25 = (byte)((uint)uVar2 >> 0x18);
            auVar27[3] = -(bStack_2c5 == bVar25);
            auVar27[4] = -(cStack_2c4 == cVar22);
            auVar27[5] = -(cStack_2c3 == cVar23);
            auVar27[6] = -(cStack_2c2 == cVar24);
            auVar27[7] = -(bStack_2c1 == bVar25);
            auVar27[8] = -(cStack_2c0 == cVar22);
            auVar27[9] = -(cStack_2bf == cVar23);
            auVar27[10] = -(cStack_2be == cVar24);
            auVar27[0xb] = -(bStack_2bd == bVar25);
            auVar27[0xc] = -(cStack_2bc == cVar22);
            auVar27[0xd] = -(cStack_2bb == cVar23);
            auVar27[0xe] = -(cStack_2ba == cVar24);
            auVar27[0xf] = -(bStack_2b9 == bVar25);
            uVar21 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
            if (uVar21 != 0) {
              do {
                uVar7 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                pSVar13 = *(Symbol **)(targetChain._72_8_ + uVar18 * 0x78 + (ulong)uVar7 * 8);
                if (local_3a0 == pSVar13) {
                  if ((bVar20 & 1) == 0) goto LAB_002396ad;
                  pSVar13 = Scope::getContainingInstanceOrChecker((Scope *)pSVar13);
                  if (pSVar13 != (Symbol *)0x0) {
                    psVar15 = &pSVar13[2].name;
                    if (pSVar13->kind != InstanceBody) {
                      psVar15 = (string_view *)((long)&pSVar13[2].name._M_str + 5);
                    }
                    if ((psVar15->_M_len & 4) != 0) goto LAB_002396ad;
                  }
                  psVar15 = &local_3a0->name;
                  goto LAB_002396bb;
                }
                uVar21 = uVar21 - 1 & uVar21;
              } while (uVar21 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_2b9) == 0)
            break;
            lVar17 = uVar18 + uVar16;
            uVar16 = uVar16 + 1;
            uVar18 = lVar17 + 1U & targetChain._56_8_;
          } while (uVar16 <= (ulong)targetChain._56_8_);
          pSVar13 = (Symbol *)(local_3a0->name)._M_len;
          SVar3 = pSVar13->kind;
          if (SVar3 == InstanceBody) {
            local_3a0 = (Symbol *)
                        (((InstanceSymbol *)pSVar13[1].originatingSyntax)->super_InstanceSymbolBase)
                        .super_Symbol.parentScope;
            sVar11 = pSVar13[2].name._M_len;
            local_390 = pSVar13;
            sVar30 = InstanceSymbol::getPortConnections
                               ((InstanceSymbol *)pSVar13[1].originatingSyntax);
            bVar20 = bVar20 | (byte)sVar11 >> 2;
            lVar17 = 0;
LAB_00239635:
            if (sVar30._M_extent._M_extent_value._M_extent_value << 3 != lVar17) {
              IVar31 = PortConnection::getIfaceConn
                                 (*(PortConnection **)((long)sVar30._M_ptr + lVar17));
              pSVar13 = IVar31.first;
              if ((pSVar13 == (Symbol *)0x0) ||
                 ((pSVar13->kind != InstanceArray &&
                  ((pSVar13->parentScope == (Scope *)0x0 ||
                   (pSVar13->parentScope->thisSym->kind != InstanceArray)))))) goto LAB_0023965f;
              psVar15 = (string_view *)&local_390[1].originatingSyntax;
LAB_002396bb:
              pSVar13 = (Symbol *)psVar15->_M_len;
              goto LAB_002396be;
            }
            goto LAB_0023966a;
          }
          if ((SVar3 == InstanceArray) || (SVar3 == GenerateBlock)) goto LAB_002396be;
          local_3a0 = (Symbol *)pSVar13->parentScope;
LAB_0023966a:
        } while (local_3a0 != (Symbol *)0x0);
LAB_002396ad:
        pSVar13 = (Symbol *)0x0;
LAB_002396be:
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Scope_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Scope_*,_32UL,_16UL>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Scope_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::Scope_*,_32UL,_16UL>_>
                       *)&targetChain.super_Storage.field_0x28);
        if (pSVar13 == (Symbol *)0x0) {
          lhs = (SourceLocation)local_398->lastMember->nextInScope;
          SVar29 = parsing::Token::range((Token *)&local_398->lastMember->location);
          rhs = (ExpressionSyntax *)pSVar4[1].name._M_str;
          if ((rhs == (ExpressionSyntax *)0x0 ||
               *(int *)((long)&pSVar4[1].originatingSyntax + 4) < 0) ||
             ((rhs->super_SyntaxNode).kind != ImplicitType)) {
            this_00 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
            assignmentRange.endLoc = (SourceLocation)local_300;
            assignmentRange.startLoc = SVar29.endLoc;
            local_318._8_8_ =
                 Expression::bindRValue
                           ((Expression *)this_00,(Type *)lhs,(ExpressionSyntax *)SVar29.startLoc,
                            assignmentRange,(ASTContext *)0x0,in_stack_fffffffffffffc58);
          }
          else {
            local_398 = pSVar4->parentScope;
            LVar28 = LookupLocation::before(pSVar4);
            targetChain.super_Storage.buffer._0_8_ = local_398;
            targetChain.super_Storage.buffer._8_4_ = LVar28.index;
            targetChain.super_Storage.buffer[0x10] = '\0';
            targetChain.super_Storage.buffer[0x11] = '\0';
            targetChain.super_Storage.buffer[0x12] = '\0';
            targetChain.super_Storage.buffer[0x13] = '\0';
            targetChain.super_Storage.buffer[0x14] = '\0';
            targetChain.super_Storage.buffer[0x15] = '\0';
            targetChain.super_Storage.buffer[0x16] = '\0';
            targetChain.super_Storage.buffer[0x17] = '\0';
            targetChain.super_Storage.buffer[0x18] = '\0';
            targetChain.super_Storage.buffer[0x19] = '\0';
            targetChain.super_Storage.buffer[0x1a] = '\0';
            targetChain.super_Storage.buffer[0x1b] = '\0';
            targetChain.super_Storage.buffer[0x1c] = '\0';
            targetChain.super_Storage.buffer[0x1d] = '\0';
            targetChain.super_Storage.buffer[0x1e] = '\0';
            targetChain.super_Storage.buffer[0x1f] = '\0';
            targetChain.super_Storage._32_16_ = (undefined1  [16])0x0;
            targetChain._48_8_ = 0;
            assignmentRange_00.endLoc = SVar29.startLoc;
            assignmentRange_00.startLoc = lhs;
            Expression::bindImplicitParam
                      ((DataTypeSyntax *)local_318,rhs,assignmentRange_00,
                       (ASTContext *)SVar29.endLoc,(ASTContext *)local_300,
                       (bitmask<slang::ast::ASTFlags>)&targetChain);
          }
          this->initializer = (Expression *)local_318._8_8_;
          ASTContext::eval((ConstantValue *)&local_2a0,(ASTContext *)local_300,
                           (Expression *)local_318._8_8_,(bitmask<slang::ast::EvalFlags>)0x0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_2a0);
          if (this->initializer->constant == (ConstantValue *)0x0) {
            this->initializer->constant = (ConstantValue *)ConstantValue::Invalid;
          }
        }
        else {
          SVar29 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_398->firstMember);
          pDVar12 = ASTContext::addDiag((ASTContext *)local_300,(DiagCode)0x2b0006,SVar29);
          Diagnostic::addNote(pDVar12,(DiagCode)0xe50006,pSVar13->location);
          resolve::anon_class_16_2_3fde98ca::operator()(&makeInvalid);
        }
      }
      goto LAB_00239395;
    }
    SVar29 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_398->firstMember);
    pDVar12 = ASTContext::addDiag((ASTContext *)local_300,(DiagCode)0x290006,SVar29);
    Diagnostic::addNote(pDVar12,(DiagCode)0x50001,this->target->location);
    this->target = (Symbol *)0x0;
  }
  resolve::anon_class_16_2_3fde98ca::operator()(&makeInvalid);
LAB_00239395:
  LookupResult::~LookupResult(&result);
  return;
LAB_0023965f:
  lVar17 = lVar17 + 8;
  goto LAB_00239635;
}

Assistant:

void DefParamSymbol::resolve() const {
    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);

    auto& comp = scope->getCompilation();
    auto& assignment = syntax->as<DefParamAssignmentSyntax>();

    ASTContext context(*scope, LookupLocation::before(*this));
    LookupResult result;
    Lookup::name(*assignment.name, context, LookupFlags::NoSelectors, result);
    result.reportDiags(context);

    target = result.found;
    if (target && target->kind != SymbolKind::Parameter) {
        auto& diag = context.addDiag(diag::DefParamTarget, assignment.name->sourceRange());
        diag.addNote(diag::NoteDeclarationHere, target->location);
        target = nullptr;
    }

    auto makeInvalid = [&] {
        initializer = comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
        initializer->constant = &ConstantValue::Invalid;
    };

    if (!target) {
        makeInvalid();
        return;
    }

    auto& param = target->as<ParameterSymbol>();
    if (param.isLocalParam()) {
        context.addDiag(diag::DefParamLocal, assignment.name->sourceRange()) << param.name;
        makeInvalid();
        return;
    }

    if (auto invalidParent = checkDefparamHierarchy(*target, *scope)) {
        auto& diag = context.addDiag(diag::DefparamBadHierarchy, assignment.name->sourceRange());
        diag.addNote(diag::NoteCommonAncestor, invalidParent->location);

        makeInvalid();
        return;
    }

    // We need to know the parameter's type (or lack thereof) in order to
    // correctly bind a value for it.
    auto& exprSyntax = *assignment.setter->expr;
    auto equalsRange = assignment.setter->equals.range();
    auto declType = param.getDeclaredType();
    auto typeSyntax = declType->getTypeSyntax();

    if (typeSyntax && typeSyntax->kind == SyntaxKind::ImplicitType) {
        ASTContext typeContext(*param.getParentScope(), LookupLocation::before(param));
        auto [expr, type] = Expression::bindImplicitParam(*typeSyntax, exprSyntax, equalsRange,
                                                          context, typeContext);
        initializer = expr;
    }
    else {
        initializer = &Expression::bindRValue(declType->getType(), exprSyntax, equalsRange,
                                              context);
    }

    context.eval(*initializer);
    if (!initializer->constant)
        initializer->constant = &ConstantValue::Invalid;
}